

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

string * __thiscall
cmCTestRunTest::GetTestPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestRunTest *this,size_t completed,size_t total)

{
  int iVar1;
  _Setw _Var2;
  ostream *poVar3;
  string local_358 [36];
  int local_334;
  undefined1 local_330 [8];
  ostringstream indexStr;
  undefined1 local_1a0 [8];
  ostringstream outputStream;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  iVar1 = getNumWidth(total);
  _Var2 = std::setw(iVar1);
  poVar3 = std::operator<<((ostream *)local_1a0,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,completed);
  std::operator<<(poVar3,"/");
  iVar1 = getNumWidth(total);
  _Var2 = std::setw(iVar1);
  poVar3 = std::operator<<((ostream *)local_1a0,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,total);
  std::operator<<(poVar3," ");
  if ((this->TestHandler->MemCheck & 1U) == 0) {
    std::operator<<((ostream *)local_1a0,"Test");
  }
  else {
    std::operator<<((ostream *)local_1a0,"MemCheck");
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  poVar3 = std::operator<<((ostream *)local_330," #");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->Index);
  std::operator<<(poVar3,":");
  iVar1 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
  iVar1 = getNumWidth((long)iVar1);
  local_334 = (int)std::setw(iVar1 + 3);
  poVar3 = std::operator<<((ostream *)local_1a0,(_Setw)local_334);
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar3,local_358);
  std::__cxx11::string::~string(local_358);
  std::operator<<((ostream *)local_1a0," ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestRunTest::GetTestPrefix(size_t completed, size_t total) const
{
  std::ostringstream outputStream;
  outputStream << std::setw(getNumWidth(total)) << completed << "/";
  outputStream << std::setw(getNumWidth(total)) << total << " ";

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  return outputStream.str();
}